

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action_Response_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Action_Response_PDU::Action_Response_PDU
          (Action_Response_PDU *this,Action_Request_PDU *pdu,RequestStatus RS)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  ProtocolVersion PVar3;
  KUINT32 KVar4;
  EntityIdentifier *pEVar5;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  *__x;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
  *__x_00;
  size_type sVar6;
  RequestStatus RS_local;
  Action_Request_PDU *pdu_local;
  Action_Response_PDU *this_local;
  
  Data_PDU::Data_PDU(&this->super_Data_PDU);
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6._vptr_Header6 = (_func_int **)&PTR__Action_Response_PDU_0032f478;
  this->m_ui32RequestStatus = RS;
  PVar3 = Header6::GetProtocolVersion((Header6 *)pdu);
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6.m_ui8ProtocolVersion = (KUINT8)PVar3;
  KVar1 = Header6::GetExerciseID((Header6 *)pdu);
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6.m_ui8ExerciseID = KVar1;
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6.m_ui8PDUType = '\x11';
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6.m_ui8ProtocolFamily = '\x05';
  KVar4 = Data_PDU::GetRequestID(&pdu->super_Data_PDU);
  (this->super_Data_PDU).m_ui32RequestID = KVar4;
  pEVar5 = Simulation_Management_Header::GetOriginatingEntityID((Simulation_Management_Header *)pdu)
  ;
  DATA_TYPE::EntityIdentifier::operator=
            (&(this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.
              m_ReceivingEntityID,pEVar5);
  pEVar5 = Simulation_Management_Header::GetReceivingEntityID((Simulation_Management_Header *)pdu);
  DATA_TYPE::EntityIdentifier::operator=
            (&(this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.
              m_OriginatingEntityID,pEVar5);
  __x = Comment_PDU::GetVariableDatum((Comment_PDU *)pdu);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ::operator=(&(this->super_Data_PDU).super_Comment_PDU.m_vVariableDatum,__x);
  __x_00 = Comment_PDU::GetFixedDatum((Comment_PDU *)pdu);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
  ::operator=(&(this->super_Data_PDU).super_Comment_PDU.m_vFixedDatum,__x_00);
  sVar6 = std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
          ::size(&(this->super_Data_PDU).super_Comment_PDU.m_vFixedDatum);
  (this->super_Data_PDU).super_Comment_PDU.m_ui32NumFixedDatum = (KUINT32)sVar6;
  sVar6 = std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
          ::size(&(this->super_Data_PDU).super_Comment_PDU.m_vVariableDatum);
  (this->super_Data_PDU).super_Comment_PDU.m_ui32NumVariableDatum = (KUINT32)sVar6;
  KVar2 = Header6::GetPDULength((Header6 *)pdu);
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6.m_ui16PDULength = KVar2;
  return;
}

Assistant:

Action_Response_PDU::Action_Response_PDU( const Action_Request_PDU & pdu, RequestStatus RS ) :
    m_ui32RequestStatus( RS )
{
    m_ui8ProtocolVersion = pdu.GetProtocolVersion();
    m_ui8ExerciseID = pdu.GetExerciseID();
    m_ui8PDUType = Action_Response_PDU_Type;
    m_ui8ProtocolFamily = Simulation_Management;
    m_ui32RequestID = pdu.GetRequestID();
    m_ReceivingEntityID = pdu.GetOriginatingEntityID();
    m_OriginatingEntityID = pdu.GetReceivingEntityID();
    m_vVariableDatum = pdu.GetVariableDatum();
    m_vFixedDatum = pdu.GetFixedDatum();
    m_ui32NumFixedDatum = m_vFixedDatum.size();
    m_ui32NumVariableDatum = m_vVariableDatum.size();

    // Calculate the size
    m_ui16PDULength = pdu.GetPDULength() - Action_Request_PDU::ACTION_REQUEST_PDU_SIZE + ACTION_RESPONSE_PDU_SIZE;
}